

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

int smf_track_add_eot_seconds(smf_track_t *track,double seconds)

{
  smf_event_t *psVar1;
  int iVar2;
  
  if (((track->number_of_events != 0) &&
      (psVar1 = smf_track_get_event_by_number(track,track->number_of_events),
      psVar1 != (smf_event_t *)0x0)) && (seconds < psVar1->time_seconds)) {
    return -2;
  }
  iVar2 = 0;
  psVar1 = smf_event_new_from_bytes(0xff,0x2f,0);
  if (psVar1 == (smf_event_t *)0x0) {
    iVar2 = -1;
  }
  else {
    smf_track_add_event_seconds(track,psVar1,seconds);
  }
  return iVar2;
}

Assistant:

int
smf_track_add_eot_seconds(smf_track_t *track, double seconds)
{
	smf_event_t *event, *last_event;

	last_event = smf_track_get_last_event(track);
	if (last_event != NULL) {
		if (last_event->time_seconds > seconds)
			return (-2);
	}

	event = smf_event_new_from_bytes(0xFF, 0x2F, 0x00);
	if (event == NULL)
		return (-1);

	smf_track_add_event_seconds(track, event, seconds);

	return (0);
}